

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnEventSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index event_index)

{
  Module *pMVar1;
  bool bVar2;
  reference ppEVar3;
  string_view name_00;
  Binding local_b8;
  BinaryReaderIR *local_90;
  char *local_88;
  string local_80;
  undefined1 local_60 [8];
  string dollar_name;
  Event *event;
  Index event_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderIR *)name.data_;
  bVar2 = string_view::empty((string_view *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  }
  else {
    ppEVar3 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::operator[]
                        (&this->module_->events,(ulong)event_index);
    dollar_name.field_2._8_8_ = *ppEVar3;
    pMVar1 = this->module_;
    local_90 = this_local;
    local_88 = name_local.data_;
    name_00.size_ = dollar_name.field_2._8_8_;
    name_00.data_ = name_local.data_;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)this_local,name_00);
    GetUniqueName((string *)local_60,this,&pMVar1->event_bindings,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::operator=((string *)dollar_name.field_2._8_8_,(string *)local_60);
    pMVar1 = this->module_;
    Binding::Binding(&local_b8,event_index);
    std::
    unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
    ::emplace<std::__cxx11::string&,wabt::Binding>
              ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                *)&pMVar1->event_bindings,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
               &local_b8);
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
    std::__cxx11::string::~string((string *)local_60);
  }
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnEventSymbol(Index index, uint32_t flags,
                                     string_view name, Index event_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  Event* event = module_->events[event_index];
  std::string dollar_name =
      GetUniqueName(&module_->event_bindings, MakeDollarName(name));
  event->name = dollar_name;
  module_->event_bindings.emplace(dollar_name, Binding(event_index));
  return Result::Ok;
}